

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O0

Action<std::error_code_(long)> * __thiscall
testing::internal::TypedExpectation<std::error_code_(long)>::GetCurrentAction
          (TypedExpectation<std::error_code_(long)> *this,
          FunctionMocker<std::error_code_(long)> *mocker,ArgumentTuple *args)

{
  bool condition;
  size_type sVar1;
  ostream *poVar2;
  char *pcVar3;
  const_reference ppvVar4;
  Action<std::error_code_(long)> *local_290;
  ostream *local_278;
  ostream *local_228;
  string local_208;
  stringstream local_1e8 [8];
  stringstream ss;
  ostream local_1d8 [376];
  int local_60;
  int action_count;
  allocator local_49;
  string local_48;
  int local_24;
  ArgumentTuple *pAStack_20;
  int count;
  ArgumentTuple *args_local;
  FunctionMocker<std::error_code_(long)> *mocker_local;
  TypedExpectation<std::error_code_(long)> *this_local;
  
  pAStack_20 = args;
  args_local = (ArgumentTuple *)mocker;
  mocker_local = (FunctionMocker<std::error_code_(long)> *)this;
  MutexBase::AssertHeld((MutexBase *)g_gmock_mutex);
  local_24 = ExpectationBase::call_count(&this->super_ExpectationBase);
  condition = 0 < local_24;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_48,
             "call_count() is <= 0 when GetCurrentAction() is called - this should never happen.",
             &local_49);
  Assert(condition,
         "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/3rd_party/googletest/googlemock/include/gmock/gmock-spec-builders.h"
         ,0x494,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  sVar1 = std::vector<const_void_*,_std::allocator<const_void_*>_>::size
                    (&(this->super_ExpectationBase).untyped_actions_);
  local_60 = (int)sVar1;
  if (((0 < local_60) && (((this->super_ExpectationBase).repeated_action_specified_ & 1U) == 0)) &&
     (local_60 < local_24)) {
    std::__cxx11::stringstream::stringstream(local_1e8);
    local_228 = (ostream *)0x0;
    if (&stack0x00000000 != (undefined1 *)0x1e8) {
      local_228 = local_1d8;
    }
    ExpectationBase::DescribeLocationTo(&this->super_ExpectationBase,local_228);
    poVar2 = std::operator<<(local_1d8,"Actions ran out in ");
    pcVar3 = ExpectationBase::source_text(&this->super_ExpectationBase);
    poVar2 = std::operator<<(poVar2,pcVar3);
    poVar2 = std::operator<<(poVar2,"...\n");
    poVar2 = std::operator<<(poVar2,"Called ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_24);
    poVar2 = std::operator<<(poVar2," times, but only ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_60);
    poVar2 = std::operator<<(poVar2," WillOnce()");
    pcVar3 = "s are";
    if (local_60 == 1) {
      pcVar3 = " is";
    }
    poVar2 = std::operator<<(poVar2,pcVar3);
    std::operator<<(poVar2," specified - ");
    local_278 = (ostream *)0x0;
    if (&stack0x00000000 != (undefined1 *)0x1e8) {
      local_278 = local_1d8;
    }
    FunctionMocker<std::error_code_(long)>::DescribeDefaultActionTo
              ((FunctionMocker<std::error_code_(long)> *)args_local,pAStack_20,local_278);
    std::__cxx11::stringstream::str();
    Log(kWarning,&local_208,1);
    std::__cxx11::string::~string((string *)&local_208);
    std::__cxx11::stringstream::~stringstream(local_1e8);
  }
  if (local_60 < local_24) {
    local_290 = repeated_action(this);
  }
  else {
    ppvVar4 = std::vector<const_void_*,_std::allocator<const_void_*>_>::operator[]
                        (&(this->super_ExpectationBase).untyped_actions_,(long)(local_24 + -1));
    local_290 = (Action<std::error_code_(long)> *)*ppvVar4;
  }
  return local_290;
}

Assistant:

GTEST_EXCLUSIVE_LOCK_REQUIRED_(g_gmock_mutex) {
    g_gmock_mutex.AssertHeld();
    const int count = call_count();
    Assert(count >= 1, __FILE__, __LINE__,
           "call_count() is <= 0 when GetCurrentAction() is "
           "called - this should never happen.");

    const int action_count = static_cast<int>(untyped_actions_.size());
    if (action_count > 0 && !repeated_action_specified_ &&
        count > action_count) {
      // If there is at least one WillOnce() and no WillRepeatedly(),
      // we warn the user when the WillOnce() clauses ran out.
      ::std::stringstream ss;
      DescribeLocationTo(&ss);
      ss << "Actions ran out in " << source_text() << "...\n"
         << "Called " << count << " times, but only "
         << action_count << " WillOnce()"
         << (action_count == 1 ? " is" : "s are") << " specified - ";
      mocker->DescribeDefaultActionTo(args, &ss);
      Log(kWarning, ss.str(), 1);
    }

    return count <= action_count
               ? *static_cast<const Action<F>*>(
                     untyped_actions_[static_cast<size_t>(count - 1)])
               : repeated_action();
  }